

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_method_process.cpp
# Opt level: O1

void __thiscall
sc_core::sc_method_process::resume_process
          (sc_method_process *this,sc_descendant_inclusion_info descendants)

{
  long lVar1;
  sc_runnable *psVar2;
  int iVar3;
  undefined4 extraout_var;
  long *plVar5;
  sc_simcontext *this_00;
  ulong uVar6;
  uint uVar7;
  long *plVar4;
  
  if (descendants == SC_INCLUDE_DESCENDANTS) {
    iVar3 = (*(this->super_sc_process_b).super_sc_object._vptr_sc_object[5])(this);
    plVar4 = (long *)CONCAT44(extraout_var,iVar3);
    uVar7 = (uint)((ulong)(plVar4[1] - *plVar4) >> 3);
    if (0 < (int)uVar7) {
      uVar6 = 0;
      do {
        lVar1 = *(long *)(*plVar4 + uVar6 * 8);
        if (lVar1 == 0) {
          plVar5 = (long *)0x0;
        }
        else {
          plVar5 = (long *)__dynamic_cast(lVar1,&sc_object::typeinfo,&sc_process_b::typeinfo,0);
        }
        if (plVar5 != (long *)0x0) {
          (**(code **)(*plVar5 + 0x98))(plVar5);
        }
        uVar6 = uVar6 + 1;
      } while ((uVar7 & 0x7fffffff) != uVar6);
    }
  }
  if ((sc_allow_process_control_corners == '\0') &&
     (uVar7 = (this->super_sc_process_b).m_state, (~uVar7 & 5) == 0)) {
    (this->super_sc_process_b).m_state = uVar7 & 0xfffffffb;
    sc_process_b::report_error
              (&this->super_sc_process_b,"Undefined process control interaction",
               "call to resume() on a disabled suspended method");
  }
  uVar7 = (this->super_sc_process_b).m_state;
  (this->super_sc_process_b).m_state = uVar7 & 0xfffffffb;
  if (((uVar7 & 2) != 0) &&
     ((this->super_sc_process_b).m_state = uVar7 & 0xfffffff9,
     (this->super_sc_process_b).m_runnable_p == (sc_process_b *)0x0)) {
    if (sc_curr_simcontext == (sc_simcontext *)0x0) {
      this_00 = (sc_simcontext *)operator_new(0x168);
      sc_simcontext::sc_simcontext(this_00);
      sc_curr_simcontext = this_00;
      sc_default_global_context = this_00;
    }
    if ((sc_method_process *)(sc_curr_simcontext->m_curr_proc_info).process_handle != this) {
      psVar2 = ((this->super_sc_process_b).super_sc_object.m_simc)->m_runnable;
      (this->super_sc_process_b).m_runnable_p = (sc_process_b *)0xdb;
      (psVar2->m_methods_push_tail->super_sc_process_b).m_runnable_p = &this->super_sc_process_b;
      psVar2->m_methods_push_tail = this;
      sc_process_b::remove_dynamic_events(&this->super_sc_process_b,false);
      return;
    }
  }
  return;
}

Assistant:

void sc_method_process::resume_process(
    sc_descendant_inclusion_info descendants )
{

    // IF NEEDED PROPOGATE THE RESUME REQUEST THROUGH OUR DESCENDANTS:

    if ( descendants == SC_INCLUDE_DESCENDANTS )
    {
        const std::vector<sc_object*>& children = get_child_objects();
        int                            child_n  = children.size();

        for ( int child_i = 0; child_i < child_n; child_i++ )
        {
            sc_process_b* child_p = dynamic_cast<sc_process_b*>(children[child_i]);
            if ( child_p ) child_p->resume_process(descendants);
        }
    }


    // BY DEFAULT THE CORNER CASE IS AN ERROR:

    if ( !sc_allow_process_control_corners && (m_state & ps_bit_disabled) &&
         (m_state & ps_bit_suspended) )
    {
        m_state = m_state & ~ps_bit_suspended;
        report_error( SC_ID_PROCESS_CONTROL_CORNER_CASE_,
                      "call to resume() on a disabled suspended method" );
        // may continue, if suppressed
    }

    // CLEAR THE SUSPENDED BIT:

    m_state = m_state & ~ps_bit_suspended;

    // RESUME OBJECT INSTANCE:
    //
    // If this is not a self-resume and the method is ready to run then
    // put it on the runnable queue.

    if ( m_state & ps_bit_ready_to_run )
    {
	m_state = m_state & ~ps_bit_ready_to_run;
	if ( next_runnable() == 0 &&
	   ( sc_get_current_process_b() != dynamic_cast<sc_process_b*>(this) ) )
        {
	    simcontext()->push_runnable_method(this);
	    remove_dynamic_events();
	}
    }
}